

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginChild(char *str_id,ImVec2 *size_arg,bool border,ImGuiWindowFlags extra_flags)

{
  ImGuiWindowFlags *pIVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ImVec2 IVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  ImVec2 size;
  char title [256];
  ImVec2 local_130;
  char local_128 [256];
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  IVar6 = GetContentRegionAvail();
  iVar7 = (int)(*size_arg).x;
  iVar8 = (int)(*size_arg).y;
  local_130.x = (float)iVar7;
  local_130.y = (float)iVar8;
  uVar4 = 0x100103;
  fVar9 = IVar6.x;
  if (iVar7 < 1) {
    uVar4 = (uint)(iVar7 == 0) << 0x15 | 0x100103;
    if (fVar9 <= 4.0) {
      fVar9 = 4.0;
    }
    local_130.x = fVar9 - ABS(local_130.x);
  }
  if (iVar8 < 1) {
    uVar5 = uVar4 + 0x400000;
    if (iVar8 != 0) {
      uVar5 = uVar4;
    }
    uVar4 = uVar5;
    fVar9 = IVar6.y;
    if (fVar9 <= 4.0) {
      fVar9 = 4.0;
    }
    local_130.y = fVar9 - ABS(local_130.y);
  }
  uVar5 = uVar4 | 0x80;
  if (!border) {
    uVar5 = uVar4;
  }
  ImFormatString(local_128,0x100,"%s.%s",pIVar2->Name,str_id);
  bVar3 = Begin(local_128,(bool *)0x0,&local_130,-1.0,uVar5 | extra_flags);
  if ((pIVar2->Flags & 0x80) == 0) {
    pIVar2 = GImGui->CurrentWindow;
    pIVar2->Accessed = true;
    pIVar1 = &pIVar2->Flags;
    *(byte *)pIVar1 = (byte)*pIVar1 & 0x7f;
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginChild(const char* str_id, const ImVec2& size_arg, bool border, ImGuiWindowFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiWindowFlags flags = ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_ChildWindow;

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
    {
        if (size.x == 0.0f)
            flags |= ImGuiWindowFlags_ChildWindowAutoFitX;
        size.x = ImMax(content_avail.x, 4.0f) - fabsf(size.x); // Arbitrary minimum zero-ish child size of 4.0f (0.0f causing too much issues)
    }
    if (size.y <= 0.0f)
    {
        if (size.y == 0.0f)
            flags |= ImGuiWindowFlags_ChildWindowAutoFitY;
        size.y = ImMax(content_avail.y, 4.0f) - fabsf(size.y);
    }
    if (border)
        flags |= ImGuiWindowFlags_ShowBorders;
    flags |= extra_flags;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s.%s", window->Name, str_id);

    bool ret = ImGui::Begin(title, NULL, size, -1.0f, flags);

    if (!(window->Flags & ImGuiWindowFlags_ShowBorders))
        GetCurrentWindow()->Flags &= ~ImGuiWindowFlags_ShowBorders;

    return ret;
}